

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O2

void simgui_render(void)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  float fVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  ImDrawList *pIVar7;
  ImDrawCmd *pIVar8;
  code *pcVar9;
  ImTextureID pvVar10;
  int iVar11;
  float fVar12;
  void *pvVar13;
  size_t sVar14;
  void *pvVar15;
  size_t sVar16;
  int iVar17;
  ImDrawData *pIVar18;
  ImGuiIO *pIVar19;
  ulong uVar20;
  int iVar21;
  size_t __n_00;
  wchar_t wVar22;
  wchar_t height;
  ulong uVar23;
  long lVar24;
  wchar_t base_element;
  long lVar25;
  ImTextureID local_150;
  sg_range local_110;
  ImVec2 local_100;
  undefined8 local_f8;
  sg_range local_f0;
  sg_bindings bind;
  
  igRender();
  pIVar18 = igGetDrawData();
  pIVar19 = igGetIO();
  sVar16 = _simgui.indices.size;
  pvVar15 = _simgui.indices.ptr;
  sVar14 = _simgui.vertices.size;
  pvVar13 = _simgui.vertices.ptr;
  if ((pIVar18 != (ImDrawData *)0x0) && (iVar21 = pIVar18->CmdListsCount, iVar21 != 0)) {
    uVar20 = 0;
    uVar23 = 0;
    for (lVar24 = 0; lVar24 < iVar21; lVar24 = lVar24 + 1) {
      pIVar7 = pIVar18->CmdLists[lVar24];
      iVar21 = (pIVar7->VtxBuffer).Size;
      __n_00 = (long)iVar21 * 0x14;
      uVar1 = __n_00 + uVar23;
      if (sVar14 < uVar1) break;
      wVar22 = (pIVar7->IdxBuffer).Size;
      __n = (long)wVar22 * 2;
      uVar2 = __n + uVar20;
      if (sVar16 < uVar2) break;
      if (iVar21 != 0) {
        memcpy((void *)(uVar23 + (long)pvVar13),(pIVar7->VtxBuffer).Data,__n_00);
      }
      if (wVar22 != L'\0') {
        memcpy((void *)(uVar20 + (long)pvVar15),(pIVar7->IdxBuffer).Data,__n);
      }
      iVar21 = pIVar18->CmdListsCount;
      uVar20 = uVar2;
      uVar23 = uVar1;
    }
    if (lVar24 != 0) {
      sg_push_debug_group("sokol-imgui");
      if (uVar23 != 0) {
        bind._0_8_ = _simgui.vertices.ptr;
        bind.vertex_buffers._4_8_ = uVar23;
        sg_update_buffer(_simgui.vbuf,(sg_range *)&bind);
      }
      if (uVar20 != 0) {
        bind._0_8_ = _simgui.indices.ptr;
        bind.vertex_buffers._4_8_ = uVar20;
        sg_update_buffer(_simgui.ibuf,(sg_range *)&bind);
      }
      fVar12 = _simgui.desc.dpi_scale;
      wVar22 = (wchar_t)((pIVar19->DisplaySize).x * _simgui.desc.dpi_scale);
      height = (wchar_t)((pIVar19->DisplaySize).y * _simgui.desc.dpi_scale);
      sg_apply_viewport(L'\0',L'\0',wVar22,height,true);
      sg_apply_scissor_rect(L'\0',L'\0',wVar22,height,true);
      sg_apply_pipeline(_simgui.pip);
      local_f0.ptr = &local_100;
      local_f8 = 0;
      local_100 = pIVar19->DisplaySize;
      local_f0.size = 0x10;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f0);
      memset(&bind,0,0xb0);
      bind.vertex_buffers[0].id = _simgui.vbuf.id;
      bind.index_buffer = _simgui.ibuf;
      local_150 = pIVar19->Fonts->TexID;
      bind.fs_images[0].id = (uint32_t)local_150;
      iVar17 = 0;
      iVar21 = 0;
      for (lVar25 = 0; lVar24 != lVar25; lVar25 = lVar25 + 1) {
        pIVar7 = pIVar18->CmdLists[lVar25];
        bind.vertex_buffer_offsets[0] = iVar21;
        bind.index_buffer_offset = iVar17;
        sg_apply_bindings(&bind);
        uVar5 = (pIVar7->CmdBuffer).Size;
        uVar23 = 0;
        uVar20 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar20 = uVar23;
        }
        base_element = L'\0';
        iVar11 = 0;
        for (; uVar20 * 0x38 != uVar23; uVar23 = uVar23 + 0x38) {
          pIVar8 = (pIVar7->CmdBuffer).Data;
          pcVar9 = *(code **)((long)&pIVar8->UserCallback + uVar23);
          if (pcVar9 == (code *)0x0) {
            pvVar10 = *(ImTextureID *)((long)&pIVar8->TextureId + uVar23);
            iVar6 = *(int *)((long)&pIVar8->VtxOffset + uVar23);
            if ((local_150 != pvVar10) || (iVar11 != iVar6)) {
              bind.fs_images[0].id = (uint32_t)pvVar10;
              bind.vertex_buffer_offsets[0] = iVar6 * 0x14 + iVar21;
              sg_apply_bindings(&bind);
              local_150 = pvVar10;
              iVar11 = iVar6;
            }
            fVar3 = *(float *)((long)&(pIVar8->ClipRect).x + uVar23);
            fVar4 = *(float *)((long)&(pIVar8->ClipRect).y + uVar23);
            sg_apply_scissor_rect
                      ((int)(fVar12 * fVar3),(int)(fVar12 * fVar4),
                       (int)((*(float *)((long)&(pIVar8->ClipRect).z + uVar23) - fVar3) * fVar12),
                       (int)((*(float *)((long)&(pIVar8->ClipRect).w + uVar23) - fVar4) * fVar12),
                       true);
            sg_draw(base_element,*(wchar_t *)((long)&pIVar8->ElemCount + uVar23),L'\x01');
          }
          else {
            (*pcVar9)();
            sg_apply_viewport(L'\0',L'\0',wVar22,height,true);
            sg_apply_pipeline(_simgui.pip);
            local_110.ptr = &local_100;
            local_110.size = 0x10;
            sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_110);
            sg_apply_bindings(&bind);
          }
          base_element = base_element + *(int *)((long)&pIVar8->ElemCount + uVar23);
        }
        iVar21 = iVar21 + (pIVar7->VtxBuffer).Size * 0x14;
        iVar17 = iVar17 + (pIVar7->IdxBuffer).Size * 2;
      }
      sg_apply_viewport(L'\0',L'\0',wVar22,height,true);
      sg_apply_scissor_rect(L'\0',L'\0',wVar22,height,true);
      sg_pop_debug_group();
    }
  }
  return;
}

Assistant:

SOKOL_API_IMPL void simgui_render(void) {
    #if defined(__cplusplus)
        ImGui::Render();
        ImDrawData* draw_data = ImGui::GetDrawData();
        ImGuiIO* io = &ImGui::GetIO();
    #else
        igRender();
        ImDrawData* draw_data = igGetDrawData();
        ImGuiIO* io = igGetIO();
    #endif
    if (0 == draw_data) {
        return;
    }
    if (draw_data->CmdListsCount == 0) {
        return;
    }
    /* copy vertices and indices into an intermediate buffer so that
       they can be updated with a single sg_update_buffer() call each
       (sg_append_buffer() has performance problems on some GL platforms),
       also keep track of valid number of command lists in case of a
       buffer overflow
    */
    size_t all_vtx_size = 0;
    size_t all_idx_size = 0;
    int cmd_list_count = 0;
    for (int cl_index = 0; cl_index < draw_data->CmdListsCount; cl_index++, cmd_list_count++) {
        ImDrawList* cl = draw_data->CmdLists[cl_index];
        const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
        const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);

        /* check for buffer overflow */
        if (((all_vtx_size + vtx_size) > _simgui.vertices.size) ||
            ((all_idx_size + idx_size) > _simgui.indices.size))
        {
            break;
        }

        /* copy vertices and indices into common buffers */
        if (vtx_size > 0) {
            const ImDrawVert* src_vtx_ptr = cl->VtxBuffer.Data;
            void* dst_vtx_ptr = (void*) (((uint8_t*)_simgui.vertices.ptr) + all_vtx_size);
            memcpy(dst_vtx_ptr, src_vtx_ptr, vtx_size);
        }
        if (idx_size > 0) {
            const ImDrawIdx* src_idx_ptr = cl->IdxBuffer.Data;
            void* dst_idx_ptr = (void*) (((uint8_t*)_simgui.indices.ptr) + all_idx_size);
            memcpy(dst_idx_ptr, src_idx_ptr, idx_size);
        }
        all_vtx_size += vtx_size;
        all_idx_size += idx_size;
    }
    if (0 == cmd_list_count) {
        return;
    }

    /* update the sokol-gfx vertex- and index-buffer */
    sg_push_debug_group("sokol-imgui");
    if (all_vtx_size > 0) {
        sg_range vtx_data = _simgui.vertices;
        vtx_data.size = all_vtx_size;
        sg_update_buffer(_simgui.vbuf, &vtx_data);
    }
    if (all_idx_size > 0) {
        sg_range idx_data = _simgui.indices;
        idx_data.size = all_idx_size;
        sg_update_buffer(_simgui.ibuf, &idx_data);
    }

    /* render the ImGui command list */
    const float dpi_scale = _simgui.desc.dpi_scale;
    const int fb_width = (int) (io->DisplaySize.x * dpi_scale);
    const int fb_height = (int) (io->DisplaySize.y * dpi_scale);
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);

    sg_apply_pipeline(_simgui.pip);
    _simgui_vs_params_t vs_params;
    memset((void*)&vs_params, 0, sizeof(vs_params));
    vs_params.disp_size.x = io->DisplaySize.x;
    vs_params.disp_size.y = io->DisplaySize.y;
    sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
    sg_bindings bind;
    memset((void*)&bind, 0, sizeof(bind));
    bind.vertex_buffers[0] = _simgui.vbuf;
    bind.index_buffer = _simgui.ibuf;
    ImTextureID tex_id = io->Fonts->TexID;
    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
    int vb_offset = 0;
    int ib_offset = 0;
    for (int cl_index = 0; cl_index < cmd_list_count; cl_index++) {
        const ImDrawList* cl = draw_data->CmdLists[cl_index];

        bind.vertex_buffer_offsets[0] = vb_offset;
        bind.index_buffer_offset = ib_offset;
        sg_apply_bindings(&bind);

        int base_element = 0;
        #if defined(__cplusplus)
            const int num_cmds = cl->CmdBuffer.size();
        #else
            const int num_cmds = cl->CmdBuffer.Size;
        #endif
        uint32_t vtx_offset = 0;
        for (int cmd_index = 0; cmd_index < num_cmds; cmd_index++) {
            ImDrawCmd* pcmd = &cl->CmdBuffer.Data[cmd_index];
            if (pcmd->UserCallback) {
                pcmd->UserCallback(cl, pcmd);
                // need to re-apply all state after calling a user callback
                sg_apply_viewport(0, 0, fb_width, fb_height, true);
                sg_apply_pipeline(_simgui.pip);
                sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
                sg_apply_bindings(&bind);
            }
            else {
                if ((tex_id != pcmd->TextureId) || (vtx_offset != pcmd->VtxOffset)) {
                    tex_id = pcmd->TextureId;
                    vtx_offset = pcmd->VtxOffset;
                    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
                    bind.vertex_buffer_offsets[0] = vb_offset + (int)(pcmd->VtxOffset * sizeof(ImDrawVert));
                    sg_apply_bindings(&bind);
                }
                const int scissor_x = (int) (pcmd->ClipRect.x * dpi_scale);
                const int scissor_y = (int) (pcmd->ClipRect.y * dpi_scale);
                const int scissor_w = (int) ((pcmd->ClipRect.z - pcmd->ClipRect.x) * dpi_scale);
                const int scissor_h = (int) ((pcmd->ClipRect.w - pcmd->ClipRect.y) * dpi_scale);
                sg_apply_scissor_rect(scissor_x, scissor_y, scissor_w, scissor_h, true);
                sg_draw(base_element, (int)pcmd->ElemCount, 1);
            }
            base_element += (int)pcmd->ElemCount;
        }
        #if defined(__cplusplus)
            const size_t vtx_size = cl->VtxBuffer.size() * sizeof(ImDrawVert);
            const size_t idx_size = cl->IdxBuffer.size() * sizeof(ImDrawIdx);
        #else
            const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
            const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);
        #endif
        vb_offset += (int)vtx_size;
        ib_offset += (int)idx_size;
    }
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);
    sg_pop_debug_group();
}